

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O1

void __thiscall FConsoleBuffer::WriteLineToLog(FConsoleBuffer *this,FILE *LogFile,char *outline)

{
  size_t sVar1;
  byte *__s;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  
  sVar1 = strlen(outline);
  __s = (byte *)operator_new__(sVar1 + 1);
  pbVar2 = __s;
  do {
    while( true ) {
      bVar3 = *outline;
      if (bVar3 != 0x1c) break;
      if (((byte *)outline)[1] == 0x5b) {
        for (pbVar4 = (byte *)outline + 2; (bVar3 = *pbVar4, bVar3 != 0 && (bVar3 != 0x5d));
            pbVar4 = pbVar4 + 1) {
        }
        outline = (char *)(pbVar4 + (bVar3 == 0x5d));
      }
      else {
        if (((byte *)outline)[1] == 0) goto LAB_00354f35;
        outline = (char *)((byte *)outline + 2);
      }
    }
    if (bVar3 < 0x1e) {
      if (bVar3 == 0) {
LAB_00354f35:
        *pbVar2 = 0;
        fputs((char *)__s,(FILE *)LogFile);
        operator_delete__(__s);
        fflush((FILE *)LogFile);
        return;
      }
      if (bVar3 == 0x1d) {
        bVar3 = 0x3c;
      }
    }
    else if (bVar3 == 0x1e) {
      bVar3 = 0x2d;
    }
    else if (bVar3 == 0x1f) {
      bVar3 = 0x3e;
    }
    *pbVar2 = bVar3;
    pbVar2 = pbVar2 + 1;
    outline = (char *)((byte *)outline + 1);
  } while( true );
}

Assistant:

void FConsoleBuffer::WriteLineToLog(FILE *LogFile, const char *outline)
{
	// Strip out any color escape sequences before writing to the log file
	char * copy = new char[strlen(outline)+1];
	const char * srcp = outline;
	char * dstp = copy;

	while (*srcp != 0)
	{

		if (*srcp != TEXTCOLOR_ESCAPE)
		{
			switch (*srcp)
			{
				case '\35':
					*dstp++ = '<';
					break;
				
				case '\36':
					*dstp++ = '-';
					break;
				
				case '\37':
					*dstp++ = '>';
					break;
					
				default:
					*dstp++=*srcp;
					break;
			}
			srcp++;
		}
		else if (srcp[1] == '[')
		{
			srcp+=2;
			while (*srcp != ']' && *srcp != 0) srcp++;
			if (*srcp == ']') srcp++;
		}
		else
		{
			if (srcp[1]!=0) srcp+=2;
			else break;
		}
	}
	*dstp=0;

	fputs (copy, LogFile);
	delete [] copy;
	fflush (LogFile);
}